

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void gen_codes(ct_data *tree,int max_code,ushf *bl_count)

{
  ushort uVar1;
  uint uVar2;
  int local_54;
  int len;
  int n;
  int bits;
  ush code;
  ush next_code [16];
  ushf *bl_count_local;
  int max_code_local;
  ct_data *tree_local;
  
  n._2_2_ = 0;
  for (len = 1; len < 0x10; len = len + 1) {
    n._2_2_ = (n._2_2_ + bl_count[len + -1]) * 2;
    *(short *)((long)&bits + (long)len * 2) = n._2_2_;
  }
  for (local_54 = 0; local_54 <= max_code; local_54 = local_54 + 1) {
    uVar2 = (uint)tree[local_54].dl.dad;
    if (uVar2 != 0) {
      uVar1 = *(ushort *)((long)&bits + (long)(int)uVar2 * 2);
      *(ushort *)((long)&bits + (long)(int)uVar2 * 2) = uVar1 + 1;
      uVar2 = bi_reverse((uint)uVar1,uVar2);
      tree[local_54].fc.freq = (ush)uVar2;
    }
  }
  return;
}

Assistant:

local void gen_codes (tree, max_code, bl_count)
    ct_data *tree;             /* the tree to decorate */
    int max_code;              /* largest code with non zero frequency */
    ushf *bl_count;            /* number of codes at each bit length */
{
    ush next_code[MAX_BITS+1]; /* next code value for each bit length */
    ush code = 0;              /* running code value */
    int bits;                  /* bit index */
    int n;                     /* code index */

    /* The distribution counts are first used to generate the code values
     * without bit reversal.
     */
    for (bits = 1; bits <= MAX_BITS; bits++) {
        next_code[bits] = code = (code + bl_count[bits-1]) << 1;
    }
    /* Check that the bit counts in bl_count are consistent. The last code
     * must be all ones.
     */
    Assert (code + bl_count[MAX_BITS]-1 == (1<<MAX_BITS)-1,
            "inconsistent bit counts");
    Tracev((stderr,"\ngen_codes: max_code %d ", max_code));

    for (n = 0;  n <= max_code; n++) {
        int len = tree[n].Len;
        if (len == 0) continue;
        /* Now reverse the bits */
        tree[n].Code = bi_reverse(next_code[len]++, len);

        Tracecv(tree != static_ltree, (stderr,"\nn %3d %c l %2d c %4x (%x) ",
             n, (isgraph(n) ? n : ' '), len, tree[n].Code, next_code[len]-1));
    }
}